

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core-C-API.cpp
# Opt level: O1

llb_task_t * llb_task_create(llb_task_delegate_t delegate)

{
  llb_task_t *plVar1;
  undefined8 in_stack_00000008;
  
  plVar1 = (llb_task_t *)operator_new(0x30);
  *(_func_void_void_ptr **)(plVar1 + 0x18) = delegate.destroy_context;
  *(_func_void_void_ptr_void_ptr_llb_task_interface_t **)(plVar1 + 0x20) = delegate.start;
  *(undefined8 *)(plVar1 + 8) = in_stack_00000008;
  *(void **)(plVar1 + 0x10) = delegate.context;
  *(_func_void_void_ptr_void_ptr_llb_task_interface_t_uintptr_t_llb_data_t_ptr **)(plVar1 + 0x28) =
       delegate.provide_value;
  *(undefined ***)plVar1 = &PTR__CAPITask_00242408;
  if (*(long *)(plVar1 + 0x18) == 0) {
    __assert_fail("cAPIDelegate.start && \"missing task start function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/Core-C-API.cpp"
                  ,0x80,"(anonymous namespace)::CAPITask::CAPITask(llb_task_delegate_t)");
  }
  if (*(long *)(plVar1 + 0x20) != 0) {
    if (*(long *)(plVar1 + 0x28) != 0) {
      return plVar1;
    }
    __assert_fail("cAPIDelegate.inputs_available && \"missing task inputs_available function\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/Core-C-API.cpp"
                  ,0x84,"(anonymous namespace)::CAPITask::CAPITask(llb_task_delegate_t)");
  }
  __assert_fail("cAPIDelegate.provide_value && \"missing task provide_value function\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/Core-C-API.cpp"
                ,0x82,"(anonymous namespace)::CAPITask::CAPITask(llb_task_delegate_t)");
}

Assistant:

llb_task_t* llb_task_create(llb_task_delegate_t delegate) {
  return (llb_task_t*) new CAPITask(delegate);
}